

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorCircle.cpp
# Opt level: O2

void __thiscall ColorCircle::showLine(ColorCircle *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  int i;
  int iVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  if (0 < (this->super_Colored).state_) {
    glColor3ub(0,0,0);
    glLineWidth((float)(this->super_Colored).line_width_);
    glBegin(2);
    for (iVar6 = 0; iVar6 < this->shape_n_; iVar6 = iVar6 + 1) {
      dVar1 = (this->super_Colored).shape_scale_;
      dVar2 = (this->super_Colored).x_;
      dVar3 = this->r_;
      dVar7 = (double)iVar6 / (double)this->shape_n_;
      dVar8 = cos((dVar7 + dVar7) * 3.141592653589);
      dVar7 = (this->super_Colored).shape_scale_;
      dVar4 = this->r_;
      dVar5 = (this->super_Colored).y_;
      dVar9 = (double)iVar6 / (double)this->shape_n_;
      dVar9 = sin((dVar9 + dVar9) * 3.141592653589);
      Colored::myglVertex2d
                (&this->super_Colored,dVar8 * dVar1 * dVar3 + dVar2,dVar7 * dVar4 * dVar9 + dVar5);
    }
    glEnd();
    return;
  }
  return;
}

Assistant:

void ColorCircle::showLine(){
    if(state_ > 0){
        glColor3ub(0, 0, 0);
        glLineWidth((float)line_width_);
        glBegin(GL_LINE_LOOP);
        for(int i=0; i<shape_n_; i++)
        {
            double xx = x_ + shape_scale_ * r_ * cos( ((double)i)/shape_n_ * 2 * MYPI );
            double yy = y_ + shape_scale_ * r_ * sin( ((double)i)/shape_n_ * 2 * MYPI );
            myglVertex2d(xx,yy);
        }
        glEnd();
    }
}